

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O2

bool __thiscall Am_Inter_Location::operator&&(Am_Inter_Location *this,Am_Inter_Location *test)

{
  int iVar1;
  Am_Inter_Location_Data *pAVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool test_as_line;
  bool local_39;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  Get_Points(test,&local_2c,&local_34,&local_30,&local_38);
  Get_As_Line(test,&local_39);
  if (local_39 == true) {
    iVar4 = local_30;
    if (local_2c < local_30) {
      iVar4 = local_2c;
    }
    if (local_30 < local_2c) {
      local_30 = local_2c;
    }
    iVar5 = local_38;
    if (local_34 < local_38) {
      iVar5 = local_34;
    }
    if (local_38 < local_34) {
      local_38 = local_34;
    }
  }
  else {
    local_30 = local_30 + local_2c;
    local_38 = local_38 + local_34;
    iVar4 = local_2c;
    iVar5 = local_34;
  }
  pAVar2 = this->data;
  iVar7 = (pAVar2->data).rect.left;
  iVar1 = (pAVar2->data).rect.top;
  iVar8 = (pAVar2->data).rect.width;
  iVar6 = (pAVar2->data).rect.height;
  if (pAVar2->as_line == true) {
    iVar9 = iVar8;
    if (iVar7 < iVar8) {
      iVar9 = iVar7;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    iVar7 = iVar6;
    if (iVar1 < iVar6) {
      iVar7 = iVar1;
    }
    if (iVar6 < iVar1) {
      iVar6 = iVar1;
    }
  }
  else {
    iVar8 = iVar8 + iVar7;
    iVar9 = iVar7;
    iVar7 = iVar1;
    iVar6 = iVar6 + iVar1;
  }
  bVar3 = false;
  if (((iVar9 < local_30) && (bVar3 = false, iVar4 <= iVar8)) && (iVar7 < local_38)) {
    bVar3 = iVar5 <= iVar6;
  }
  return bVar3;
}

Assistant:

bool
Am_Inter_Location::operator&&(const Am_Inter_Location &test) const
{
  int test_left, test_top, test_right, test_bottom;
  test.Get_Points(test_left, test_top, test_right, test_bottom);
  bool test_as_line;
  test.Get_As_Line(test_as_line);
  if (test_as_line) {
    isort(test_left, test_right, test_left, test_right);
    isort(test_top, test_bottom, test_top, test_bottom);
  } else {
    test_right += test_left;
    test_bottom += test_top;
  }
  int left, top, right, bottom;
  left = data->data.line.x1;
  top = data->data.line.y1;
  right = data->data.line.x2;
  bottom = data->data.line.y2;
  if (data->as_line) {
    isort(left, right, left, right);
    isort(top, bottom, top, bottom);
  } else {
    right += left;
    bottom += top;
  }
  return (left < test_right) && (right >= test_left) && (top < test_bottom) &&
         (bottom >= test_top);
}